

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O0

int mqttmessage_setIsDuplicateMsg(MQTT_MESSAGE_HANDLE handle,_Bool duplicateMsg)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  _Bool duplicateMsg_local;
  MQTT_MESSAGE_HANDLE handle_local;
  
  if (handle == (MQTT_MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
                ,"mqttmessage_setIsDuplicateMsg",0x140,1,"Invalid Parameter handle: %p.",0);
    }
    l._0_4_ = 0x141;
  }
  else {
    handle->isDuplicateMsg = duplicateMsg;
    l._0_4_ = 0;
  }
  return (int)l;
}

Assistant:

int mqttmessage_setIsDuplicateMsg(MQTT_MESSAGE_HANDLE handle, bool duplicateMsg)
{
    int result;
    /* Codes_SRS_MQTTMESSAGE_07_022: [If handle is NULL then mqttmessage_setIsDuplicateMsg shall return a non-zero value.] */
    if (handle == NULL)
    {
        LogError("Invalid Parameter handle: %p.", handle);
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_MQTTMESSAGE_07_023: [mqttmessage_setIsDuplicateMsg shall store the duplicateMsg value in the MQTT_MESSAGE_HANDLE handle.] */
        handle->isDuplicateMsg = duplicateMsg;
        result = 0;
    }
    return result;
}